

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCaseStats::~TestCaseStats(TestCaseStats *this)

{
  this->_vptr_TestCaseStats = (_func_int **)&PTR__TestCaseStats_00173d00;
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  TestCaseInfo::~TestCaseInfo(&this->testInfo);
  return;
}

Assistant:

TestCaseStats::~TestCaseStats() {}